

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

lu_byte luaH_getint(Table *t,lua_Integer key,TValue *res)

{
  byte bVar1;
  Value *pVVar2;
  lu_byte lVar3;
  TValue *val;
  ulong uVar4;
  
  if (((int)key != 0) && (key - 1U < (ulong)t->asize)) {
    pVVar2 = t->array;
    uVar4 = (ulong)((int)key - 1);
    bVar1 = *(byte *)((long)pVVar2 + uVar4 + 4);
    if ((bVar1 & 0xf) != 0) {
      res->tt_ = bVar1;
      res->value_ = pVVar2[-1 - uVar4];
    }
    return bVar1;
  }
  val = getintfromhash(t,key);
  lVar3 = finishnodeget(val,res);
  return lVar3;
}

Assistant:

lu_byte luaH_getint (Table *t, lua_Integer key, TValue *res) {
  unsigned k = ikeyinarray(t, key);
  if (k > 0) {
    lu_byte tag = *getArrTag(t, k - 1);
    if (!tagisempty(tag))
      farr2val(t, k - 1, tag, res);
    return tag;
  }
  else
    return finishnodeget(getintfromhash(t, key), res);
}